

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O2

void printCompositorTypeConnector(COMPOSITOR_TYPE type)

{
  if (type - COMPOSITOR_SEQUENCE < 3) {
    std::operator<<((ostream *)&std::cout,
                    &DAT_00105714 +
                    *(int *)(&DAT_00105714 + (ulong)(type - COMPOSITOR_SEQUENCE) * 4));
    return;
  }
  return;
}

Assistant:

void printCompositorTypeConnector(XSModelGroup::COMPOSITOR_TYPE type)
{
    switch (type) {
        case XSModelGroup::COMPOSITOR_SEQUENCE :
            std::cout << ",";
            break;
        case XSModelGroup::COMPOSITOR_CHOICE :
            std::cout << "|";
            break;
        case XSModelGroup::COMPOSITOR_ALL :
            std::cout << "*";
            break;
    }
}